

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_mfsrin(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *local_38;
  TCGTemp *local_30;
  
  if (ctx->pr != true) {
    s = ctx->uc->tcg_ctx;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    tcg_gen_extract_i64_ppc64
              (s,(TCGv_i64)((long)ts - (long)s),
               *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8)),0x1c,4);
    local_38 = (TCGTemp *)(s->cpu_env + (long)s);
    local_30 = ts;
    tcg_gen_callN_ppc64(s,helper_load_sr_ppc64,
                        (TCGTemp *)
                        ((long)&s->pool_cur +
                        *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8))),2,&local_38)
    ;
    tcg_temp_free_internal_ppc64(s,ts);
    return;
  }
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_mfsrin(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    CHK_SV;
    t0 = tcg_temp_new(tcg_ctx);
    tcg_gen_extract_tl(tcg_ctx, t0, cpu_gpr[rB(ctx->opcode)], 28, 4);
    gen_helper_load_sr(tcg_ctx, cpu_gpr[rD(ctx->opcode)], tcg_ctx->cpu_env, t0);
    tcg_temp_free(tcg_ctx, t0);
}